

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

ssize_t __thiscall QPDFWriter::write(QPDFWriter *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  element_type *peVar2;
  Buffer *pBVar3;
  ssize_t extraout_RAX;
  ulong i;
  
  doWriteSetup(this);
  sVar1 = QPDF::getObjectCount
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pdf);
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  i = sVar1 << (peVar2->linearized & 0x3fU);
  if ((i & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  peVar2->events_expected = (int)i;
  prepareFileForWrite(this);
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      linearized == true) {
    writeLinearized(this);
  }
  else {
    writeStandard(this);
  }
  ::qpdf::pl::Count::finish
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline);
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->close_file == true) {
    fclose((FILE *)peVar2->file);
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  peVar2->file = (FILE *)0x0;
  if (peVar2->buffer_pipeline != (Pl_Buffer *)0x0) {
    pBVar3 = Pl_Buffer::getBuffer(peVar2->buffer_pipeline);
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->output_buffer = pBVar3;
    peVar2->buffer_pipeline = (Pl_Buffer *)0x0;
  }
  indicateProgress(this,false,true);
  return extraout_RAX;
}

Assistant:

void
QPDFWriter::write()
{
    doWriteSetup();

    // Set up progress reporting. For linearized files, we write two passes. events_expected is an
    // approximation, but it's good enough for progress reporting, which is mostly a guess anyway.
    m->events_expected = QIntC::to_int(m->pdf.getObjectCount() * (m->linearized ? 2 : 1));

    prepareFileForWrite();

    if (m->linearized) {
        writeLinearized();
    } else {
        writeStandard();
    }

    m->pipeline->finish();
    if (m->close_file) {
        fclose(m->file);
    }
    m->file = nullptr;
    if (m->buffer_pipeline) {
        m->output_buffer = m->buffer_pipeline->getBuffer();
        m->buffer_pipeline = nullptr;
    }
    indicateProgress(false, true);
}